

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O0

void __thiscall tst_GenericModel::moveRowsTreeSameBranch(tst_GenericModel *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  const_reference pQVar4;
  QModelIndex local_1148;
  QModelIndex local_1130;
  undefined1 local_1118 [8];
  value_type args_3;
  qsizetype local_10f8;
  QSignalSpy *local_10f0;
  QSignalSpy *spy_9;
  QSignalSpy **__end1_9;
  QSignalSpy **__begin1_9;
  QSignalSpy *(*__range1_9) [2];
  QVariant local_10c8;
  QChar local_10a6;
  QLatin1Char local_10a3;
  QChar local_10a2;
  QModelIndex local_10a0;
  QVariant local_1088;
  QChar local_1066;
  QLatin1Char local_1063;
  QChar local_1062;
  QModelIndex local_1060;
  QVariant local_1048;
  QChar local_1026;
  QLatin1Char local_1023;
  QChar local_1022;
  QModelIndex local_1020;
  QVariant local_1008;
  QChar local_fe6;
  QLatin1Char local_fe3;
  QChar local_fe2;
  QModelIndex local_fe0;
  QVariant local_fc8;
  QChar local_fa6;
  QLatin1Char local_fa3;
  QChar local_fa2;
  QModelIndex local_fa0;
  QVariant local_f88;
  QChar local_f66;
  QLatin1Char local_f63;
  QChar local_f62;
  QModelIndex local_f60;
  QVariant local_f48;
  QChar local_f22;
  QModelIndex local_f20;
  QVariant local_f08;
  QModelIndex local_ee8;
  QVariant local_ed0;
  QModelIndex local_eb0;
  QVariant local_e98;
  QModelIndex local_e78;
  QVariant local_e60;
  QModelIndex local_e40;
  QVariant local_e28;
  QModelIndex local_e08;
  QVariant local_df0;
  undefined1 local_dd0 [24];
  QPersistentModelIndex local_db8 [8];
  QPersistentModelIndex oneIndex;
  QModelIndex local_d98;
  undefined1 local_d80 [8];
  value_type args_2;
  qsizetype local_d60;
  QSignalSpy *local_d58;
  QSignalSpy *spy_8;
  QSignalSpy **__end1_8;
  QSignalSpy **__begin1_8;
  QSignalSpy *(*__range1_8) [2];
  QVariant local_d30;
  QChar local_d0e;
  QLatin1Char local_d0b;
  QChar local_d0a;
  QModelIndex local_d08;
  QVariant local_cf0;
  QChar local_cce;
  QLatin1Char local_ccb;
  QChar local_cca;
  QModelIndex local_cc8;
  QVariant local_cb0;
  QChar local_c8e;
  QLatin1Char local_c8b;
  QChar local_c8a;
  QModelIndex local_c88;
  QVariant local_c70;
  QChar local_c4e;
  QLatin1Char local_c4b;
  QChar local_c4a;
  QModelIndex local_c48;
  QVariant local_c30;
  QChar local_c0e;
  QLatin1Char local_c0b;
  QChar local_c0a;
  QModelIndex local_c08;
  QVariant local_bf0;
  QChar local_bce;
  QLatin1Char local_bcb;
  QChar local_bca;
  QModelIndex local_bc8;
  QVariant local_bb0;
  QChar local_b8a;
  QModelIndex local_b88;
  QVariant local_b70;
  QModelIndex local_b50;
  QVariant local_b38;
  QModelIndex local_b18;
  QVariant local_b00;
  QModelIndex local_ae0;
  QVariant local_ac8;
  QModelIndex local_aa8;
  QVariant local_a90;
  QModelIndex local_a70;
  QVariant local_a58;
  undefined1 local_a38 [24];
  QModelIndex local_a20;
  QModelIndex local_a08;
  undefined1 local_9f0 [8];
  value_type args_1;
  qsizetype local_9d0;
  QSignalSpy *local_9c8;
  QSignalSpy *spy_7;
  QSignalSpy **__end1_7;
  QSignalSpy **__begin1_7;
  QSignalSpy *(*__range1_7) [2];
  QVariant local_9a0;
  QChar local_97e;
  QLatin1Char local_97b;
  QChar local_97a;
  QModelIndex local_978;
  QVariant local_960;
  QChar local_93e;
  QLatin1Char local_93b;
  QChar local_93a;
  QModelIndex local_938;
  QVariant local_920;
  QChar local_8fe;
  QLatin1Char local_8fb;
  QChar local_8fa;
  QModelIndex local_8f8;
  QVariant local_8e0;
  QChar local_8be;
  QLatin1Char local_8bb;
  QChar local_8ba;
  QModelIndex local_8b8;
  QVariant local_8a0;
  QChar local_87e;
  QLatin1Char local_87b;
  QChar local_87a;
  QModelIndex local_878;
  QVariant local_860;
  QChar local_83e;
  QLatin1Char local_83b;
  QChar local_83a;
  QModelIndex local_838;
  QVariant local_820;
  QChar local_7fa;
  QModelIndex local_7f8;
  QVariant local_7e0;
  QModelIndex local_7c0;
  QVariant local_7a8;
  QModelIndex local_788;
  QVariant local_770;
  QModelIndex local_750;
  QVariant local_738;
  QModelIndex local_718;
  QVariant local_700;
  QModelIndex local_6e0;
  QVariant local_6c8;
  undefined1 local_6a8 [24];
  QModelIndex local_690;
  QModelIndex local_678;
  undefined1 local_660 [8];
  value_type args;
  qsizetype local_640;
  QSignalSpy *local_638;
  QSignalSpy *spy_6;
  QSignalSpy **__end1_6;
  QSignalSpy **__begin1_6;
  QSignalSpy *(*__range1_6) [2];
  QVariant local_610;
  QChar local_5ee;
  QLatin1Char local_5eb;
  QChar local_5ea;
  QModelIndex local_5e8;
  QVariant local_5d0;
  QChar local_5ae;
  QLatin1Char local_5ab;
  QChar local_5aa;
  QModelIndex local_5a8;
  QVariant local_590;
  QChar local_56e;
  QLatin1Char local_56b;
  QChar local_56a;
  QModelIndex local_568;
  QVariant local_550;
  QChar local_52e;
  QLatin1Char local_52b;
  QChar local_52a;
  QModelIndex local_528;
  QVariant local_510;
  QChar local_4ee;
  QLatin1Char local_4eb;
  QChar local_4ea;
  QModelIndex local_4e8;
  QVariant local_4d0;
  QChar local_4ae;
  QLatin1Char local_4ab;
  QChar local_4aa;
  QModelIndex local_4a8;
  QVariant local_490;
  QChar local_46a;
  QModelIndex local_468;
  QVariant local_450;
  QModelIndex local_430;
  QVariant local_418;
  QModelIndex local_3f8;
  QVariant local_3e0;
  QModelIndex local_3c0;
  QVariant local_3a8;
  QModelIndex local_388;
  QVariant local_370;
  QModelIndex local_350;
  QVariant local_338;
  undefined1 local_318 [24];
  QPersistentModelIndex local_300 [8];
  QPersistentModelIndex twoIndex;
  qint32 local_2f4;
  qsizetype local_2f0;
  QSignalSpy *local_2e8;
  QSignalSpy *spy_5;
  QSignalSpy **__end1_5;
  QSignalSpy **__begin1_5;
  QSignalSpy *(*__range1_5) [2];
  qsizetype local_2c0;
  QSignalSpy *local_2b8;
  QSignalSpy *spy_4;
  QSignalSpy **__end1_4;
  QSignalSpy **__begin1_4;
  QSignalSpy *(*__range1_4) [2];
  qsizetype local_290;
  QSignalSpy *local_288;
  QSignalSpy *spy_3;
  QSignalSpy **__end1_3;
  QSignalSpy **__begin1_3;
  QSignalSpy *(*__range1_3) [2];
  qsizetype local_260;
  QSignalSpy *local_258;
  QSignalSpy *spy_2;
  QSignalSpy **__end1_2;
  QSignalSpy **__begin1_2;
  QSignalSpy *(*__range1_2) [2];
  qsizetype local_230;
  QSignalSpy *local_228;
  QSignalSpy *spy_1;
  QSignalSpy **__end1_1;
  QSignalSpy **__begin1_1;
  QSignalSpy *(*__range1_1) [2];
  qsizetype local_200;
  QSignalSpy *local_1f8;
  QSignalSpy *spy;
  QSignalSpy **__end1;
  QSignalSpy **__begin1;
  QSignalSpy *(*__range1) [2];
  anon_class_16_2_c8a22591 resetData;
  QSignalSpy *spyArr [2];
  undefined1 local_1b0 [8];
  QSignalSpy rowsMovedSpy;
  undefined1 local_128 [8];
  QSignalSpy rowsAboutToBeMovedSpy;
  undefined1 local_90 [8];
  QModelIndex parIndex;
  QModelIndex local_60;
  undefined1 local_38 [8];
  ModelTest probe;
  GenericModel testModel;
  tst_GenericModel *this_local;
  
  GenericModel::GenericModel((GenericModel *)&probe.field_0x8,(QObject *)0x0);
  ModelTest::ModelTest((ModelTest *)local_38,(QAbstractItemModel *)&probe.field_0x8,(QObject *)0x0);
  QModelIndex::QModelIndex(&local_60);
  GenericModel::insertColumns((int)&probe + 8,0,(QModelIndex *)0x2);
  QModelIndex::QModelIndex((QModelIndex *)&parIndex.m);
  GenericModel::insertRows((int)&probe + 8,0,(QModelIndex *)0x3);
  QModelIndex::QModelIndex((QModelIndex *)&rowsAboutToBeMovedSpy.m_waiting);
  GenericModel::index((int)local_90,(int)&probe + 8,(QModelIndex *)0x1);
  GenericModel::insertColumns((int)&probe + 8,0,(QModelIndex *)0x2);
  GenericModel::insertRows((int)&probe + 8,0,(QModelIndex *)0x6);
  QSignalSpy::QSignalSpy
            ((QSignalSpy *)local_128,(QObject *)&probe.field_0x8,
             "2rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)");
  bVar1 = QSignalSpy::isValid((QSignalSpy *)local_128);
  bVar2 = QTest::qVerify(bVar1,"rowsAboutToBeMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x67c);
  if ((bVar2 & 1) == 0) {
    rowsMovedSpy._124_4_ = 1;
  }
  else {
    QSignalSpy::QSignalSpy
              ((QSignalSpy *)local_1b0,(QObject *)&probe.field_0x8,
               "2rowsMoved(QModelIndex, int, int, QModelIndex, int)");
    bVar1 = QSignalSpy::isValid((QSignalSpy *)local_1b0);
    bVar2 = QTest::qVerify(bVar1,"rowsMovedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x67e);
    if ((bVar2 & 1) == 0) {
      rowsMovedSpy._124_4_ = 1;
    }
    else {
      resetData.parIndex = (QModelIndex *)local_128;
      spyArr[0] = (QSignalSpy *)local_1b0;
      __range1 = (QSignalSpy *(*) [2])&probe.field_0x8;
      resetData.testModel = (GenericModel *)local_90;
      moveRowsTreeSameBranch::anon_class_16_2_c8a22591::operator()
                ((anon_class_16_2_c8a22591 *)&__range1);
      bVar2 = GenericModel::moveRows
                        ((QModelIndex *)&probe.field_0x8,(int)local_90,2,(QModelIndex *)0x1,
                         (int)local_90);
      bVar2 = QTest::qVerify((bool)(~bVar2 & 1),"!testModel.moveRows(parIndex, 2, 1, parIndex, -1)",
                             "",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x688);
      if ((bVar2 & 1) == 0) {
        rowsMovedSpy._124_4_ = 1;
      }
      else {
        spy = (QSignalSpy *)(spyArr + 1);
        __end1 = (QSignalSpy **)&resetData.parIndex;
        __begin1 = __end1;
        for (; (QSignalSpy *)__end1 != spy; __end1 = __end1 + 1) {
          local_1f8 = *__end1;
          local_200 = QList<QList<QVariant>_>::count(&local_1f8->super_QList<QList<QVariant>_>);
          __range1_1._4_4_ = 0;
          bVar1 = QTest::qCompare<long_long,int>
                            (&local_200,(qint32 *)((long)&__range1_1 + 4),"spy->count()","0",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x68a);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            rowsMovedSpy._124_4_ = 1;
            goto LAB_0013889f;
          }
        }
        bVar2 = GenericModel::moveRows
                          ((QModelIndex *)&probe.field_0x8,(int)local_90,2,(QModelIndex *)0x1,
                           (int)local_90);
        bVar2 = QTest::qVerify((bool)(~bVar2 & 1),"!testModel.moveRows(parIndex, 2, 1, parIndex, 7)"
                               ,"",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0x68b);
        if ((bVar2 & 1) == 0) {
          rowsMovedSpy._124_4_ = 1;
        }
        else {
          spy_1 = (QSignalSpy *)(spyArr + 1);
          __end1_1 = (QSignalSpy **)&resetData.parIndex;
          __begin1_1 = __end1_1;
          for (; (QSignalSpy *)__end1_1 != spy_1; __end1_1 = __end1_1 + 1) {
            local_228 = *__end1_1;
            local_230 = QList<QList<QVariant>_>::count(&local_228->super_QList<QList<QVariant>_>);
            __range1_2._4_4_ = 0;
            bVar1 = QTest::qCompare<long_long,int>
                              (&local_230,(qint32 *)((long)&__range1_2 + 4),"spy->count()","0",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0x68d);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              rowsMovedSpy._124_4_ = 1;
              goto LAB_0013889f;
            }
          }
          bVar2 = GenericModel::moveRows
                            ((QModelIndex *)&probe.field_0x8,(int)local_90,-1,(QModelIndex *)0x1,
                             (int)local_90);
          bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                                 "!testModel.moveRows(parIndex, -1, 1, parIndex, 3)","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x68e);
          if ((bVar2 & 1) == 0) {
            rowsMovedSpy._124_4_ = 1;
          }
          else {
            spy_2 = (QSignalSpy *)(spyArr + 1);
            __end1_2 = (QSignalSpy **)&resetData.parIndex;
            __begin1_2 = __end1_2;
            for (; (QSignalSpy *)__end1_2 != spy_2; __end1_2 = __end1_2 + 1) {
              local_258 = *__end1_2;
              local_260 = QList<QList<QVariant>_>::count(&local_258->super_QList<QList<QVariant>_>);
              __range1_3._4_4_ = 0;
              bVar1 = QTest::qCompare<long_long,int>
                                (&local_260,(qint32 *)((long)&__range1_3 + 4),"spy->count()","0",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x690);
              if (((bVar1 ^ 0xffU) & 1) != 0) {
                rowsMovedSpy._124_4_ = 1;
                goto LAB_0013889f;
              }
            }
            bVar2 = GenericModel::moveRows
                              ((QModelIndex *)&probe.field_0x8,(int)local_90,6,(QModelIndex *)0x1,
                               (int)local_90);
            bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                                   "!testModel.moveRows(parIndex, 6, 1, parIndex, 3)","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                   ,0x691);
            if ((bVar2 & 1) == 0) {
              rowsMovedSpy._124_4_ = 1;
            }
            else {
              spy_3 = (QSignalSpy *)(spyArr + 1);
              __end1_3 = (QSignalSpy **)&resetData.parIndex;
              __begin1_3 = __end1_3;
              for (; (QSignalSpy *)__end1_3 != spy_3; __end1_3 = __end1_3 + 1) {
                local_288 = *__end1_3;
                local_290 = QList<QList<QVariant>_>::count
                                      (&local_288->super_QList<QList<QVariant>_>);
                __range1_4._4_4_ = 0;
                bVar1 = QTest::qCompare<long_long,int>
                                  (&local_290,(qint32 *)((long)&__range1_4 + 4),"spy->count()","0",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                   ,0x693);
                if (((bVar1 ^ 0xffU) & 1) != 0) {
                  rowsMovedSpy._124_4_ = 1;
                  goto LAB_0013889f;
                }
              }
              bVar2 = GenericModel::moveRows
                                ((QModelIndex *)&probe.field_0x8,(int)local_90,1,(QModelIndex *)0x2,
                                 (int)local_90);
              bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                                     "!testModel.moveRows(parIndex, 1, 2, parIndex, 2)","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                     ,0x694);
              if ((bVar2 & 1) == 0) {
                rowsMovedSpy._124_4_ = 1;
              }
              else {
                spy_4 = (QSignalSpy *)(spyArr + 1);
                __end1_4 = (QSignalSpy **)&resetData.parIndex;
                __begin1_4 = __end1_4;
                for (; (QSignalSpy *)__end1_4 != spy_4; __end1_4 = __end1_4 + 1) {
                  local_2b8 = *__end1_4;
                  local_2c0 = QList<QList<QVariant>_>::count
                                        (&local_2b8->super_QList<QList<QVariant>_>);
                  __range1_5._4_4_ = 0;
                  bVar1 = QTest::qCompare<long_long,int>
                                    (&local_2c0,(qint32 *)((long)&__range1_5 + 4),"spy->count()","0"
                                     ,
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                     ,0x696);
                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                    rowsMovedSpy._124_4_ = 1;
                    goto LAB_0013889f;
                  }
                }
                bVar2 = GenericModel::moveRows
                                  ((QModelIndex *)&probe.field_0x8,(int)local_90,1,
                                   (QModelIndex *)0x2,(int)local_90);
                bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                                       "!testModel.moveRows(parIndex, 1, 2, parIndex, 3)","",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                       ,0x697);
                if ((bVar2 & 1) == 0) {
                  rowsMovedSpy._124_4_ = 1;
                }
                else {
                  spy_5 = (QSignalSpy *)(spyArr + 1);
                  __end1_5 = (QSignalSpy **)&resetData.parIndex;
                  __begin1_5 = __end1_5;
                  for (; (QSignalSpy *)__end1_5 != spy_5; __end1_5 = __end1_5 + 1) {
                    local_2e8 = *__end1_5;
                    local_2f0 = QList<QList<QVariant>_>::count
                                          (&local_2e8->super_QList<QList<QVariant>_>);
                    local_2f4 = 0;
                    bVar1 = QTest::qCompare<long_long,int>
                                      (&local_2f0,&local_2f4,"spy->count()","0",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                       ,0x699);
                    if (((bVar1 ^ 0xffU) & 1) != 0) {
                      rowsMovedSpy._124_4_ = 1;
                      goto LAB_0013889f;
                    }
                  }
                  GenericModel::index((int)local_318,(int)&probe + 8,(QModelIndex *)0x2);
                  QPersistentModelIndex::QPersistentModelIndex(local_300,(QModelIndex *)local_318);
                  bVar2 = GenericModel::moveRows
                                    ((QModelIndex *)&probe.field_0x8,(int)local_90,2,
                                     (QModelIndex *)0x1,(int)local_90);
                  bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                         "testModel.moveRows(parIndex, 2, 1, parIndex, 4)","",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                         ,0x69c);
                  if ((bVar2 & 1) == 0) {
                    rowsMovedSpy._124_4_ = 1;
                  }
                  else {
                    GenericModel::index((int)&local_350,(int)&probe + 8,(QModelIndex *)0x0);
                    QModelIndex::data(&local_338,&local_350,0);
                    iVar3 = QVariant::toInt((bool *)&local_338);
                    bVar2 = QTest::qCompare(iVar3,0,"testModel.index(0, 0, parIndex).data().toInt()"
                                            ,"0",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x69d);
                    QVariant::~QVariant(&local_338);
                    if (((bVar2 ^ 0xff) & 1) == 0) {
                      GenericModel::index((int)&local_388,(int)&probe + 8,(QModelIndex *)0x1);
                      QModelIndex::data(&local_370,&local_388,0);
                      iVar3 = QVariant::toInt((bool *)&local_370);
                      bVar2 = QTest::qCompare(iVar3,1,
                                              "testModel.index(1, 0, parIndex).data().toInt()","1",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0x69e);
                      QVariant::~QVariant(&local_370);
                      if (((bVar2 ^ 0xff) & 1) == 0) {
                        GenericModel::index((int)&local_3c0,(int)&probe + 8,(QModelIndex *)0x2);
                        QModelIndex::data(&local_3a8,&local_3c0,0);
                        iVar3 = QVariant::toInt((bool *)&local_3a8);
                        bVar2 = QTest::qCompare(iVar3,3,
                                                "testModel.index(2, 0, parIndex).data().toInt()","3"
                                                ,
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x69f);
                        QVariant::~QVariant(&local_3a8);
                        if (((bVar2 ^ 0xff) & 1) == 0) {
                          GenericModel::index((int)&local_3f8,(int)&probe + 8,(QModelIndex *)0x3);
                          QModelIndex::data(&local_3e0,&local_3f8,0);
                          iVar3 = QVariant::toInt((bool *)&local_3e0);
                          bVar2 = QTest::qCompare(iVar3,2,
                                                  "testModel.index(3, 0, parIndex).data().toInt()",
                                                  "2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6a0);
                          QVariant::~QVariant(&local_3e0);
                          if (((bVar2 ^ 0xff) & 1) == 0) {
                            GenericModel::index((int)&local_430,(int)&probe + 8,(QModelIndex *)0x4);
                            QModelIndex::data(&local_418,&local_430,0);
                            iVar3 = QVariant::toInt((bool *)&local_418);
                            bVar2 = QTest::qCompare(iVar3,4,
                                                  "testModel.index(4, 0, parIndex).data().toInt()",
                                                  "4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6a1);
                            QVariant::~QVariant(&local_418);
                            if (((bVar2 ^ 0xff) & 1) == 0) {
                              GenericModel::index((int)&local_468,(int)&probe + 8,(QModelIndex *)0x5
                                                 );
                              QModelIndex::data(&local_450,&local_468,0);
                              iVar3 = QVariant::toInt((bool *)&local_450);
                              bVar2 = QTest::qCompare(iVar3,5,
                                                  "testModel.index(5, 0, parIndex).data().toInt()",
                                                  "5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6a2);
                              QVariant::~QVariant(&local_450);
                              if (((bVar2 ^ 0xff) & 1) == 0) {
                                GenericModel::index((int)&local_4a8,(int)&probe + 8,
                                                    (QModelIndex *)0x0);
                                QModelIndex::data(&local_490,&local_4a8,0);
                                local_46a = QVariant::value<QChar>(&local_490);
                                QLatin1Char::QLatin1Char(&local_4ab,'a');
                                QChar::QChar(&local_4aa,local_4ab);
                                bVar1 = QTest::qCompare<QChar,QChar>
                                                  (&local_46a,&local_4aa,
                                                                                                      
                                                  "testModel.index(0, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'a\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6a3);
                                QVariant::~QVariant(&local_490);
                                if (((bVar1 ^ 0xffU) & 1) == 0) {
                                  GenericModel::index((int)&local_4e8,(int)&probe + 8,
                                                      (QModelIndex *)0x1);
                                  QModelIndex::data(&local_4d0,&local_4e8,0);
                                  local_4ae = QVariant::value<QChar>(&local_4d0);
                                  QLatin1Char::QLatin1Char(&local_4eb,'b');
                                  QChar::QChar(&local_4ea,local_4eb);
                                  bVar1 = QTest::qCompare<QChar,QChar>
                                                    (&local_4ae,&local_4ea,
                                                                                                          
                                                  "testModel.index(1, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'b\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6a4);
                                  QVariant::~QVariant(&local_4d0);
                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                    GenericModel::index((int)&local_528,(int)&probe + 8,
                                                        (QModelIndex *)0x2);
                                    QModelIndex::data(&local_510,&local_528,0);
                                    local_4ee = QVariant::value<QChar>(&local_510);
                                    QLatin1Char::QLatin1Char(&local_52b,'d');
                                    QChar::QChar(&local_52a,local_52b);
                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                      (&local_4ee,&local_52a,
                                                                                                              
                                                  "testModel.index(2, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'d\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6a5);
                                    QVariant::~QVariant(&local_510);
                                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                                      GenericModel::index((int)&local_568,(int)&probe + 8,
                                                          (QModelIndex *)0x3);
                                      QModelIndex::data(&local_550,&local_568,0);
                                      local_52e = QVariant::value<QChar>(&local_550);
                                      QLatin1Char::QLatin1Char(&local_56b,'c');
                                      QChar::QChar(&local_56a,local_56b);
                                      bVar1 = QTest::qCompare<QChar,QChar>
                                                        (&local_52e,&local_56a,
                                                                                                                  
                                                  "testModel.index(3, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6a6);
                                      QVariant::~QVariant(&local_550);
                                      if (((bVar1 ^ 0xffU) & 1) == 0) {
                                        GenericModel::index((int)&local_5a8,(int)&probe + 8,
                                                            (QModelIndex *)0x4);
                                        QModelIndex::data(&local_590,&local_5a8,0);
                                        local_56e = QVariant::value<QChar>(&local_590);
                                        QLatin1Char::QLatin1Char(&local_5ab,'e');
                                        QChar::QChar(&local_5aa,local_5ab);
                                        bVar1 = QTest::qCompare<QChar,QChar>
                                                          (&local_56e,&local_5aa,
                                                                                                                      
                                                  "testModel.index(4, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'e\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6a7);
                                        QVariant::~QVariant(&local_590);
                                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                                          GenericModel::index((int)&local_5e8,(int)&probe + 8,
                                                              (QModelIndex *)0x5);
                                          QModelIndex::data(&local_5d0,&local_5e8,0);
                                          local_5ae = QVariant::value<QChar>(&local_5d0);
                                          QLatin1Char::QLatin1Char(&local_5eb,'f');
                                          QChar::QChar(&local_5ea,local_5eb);
                                          bVar1 = QTest::qCompare<QChar,QChar>
                                                            (&local_5ae,&local_5ea,
                                                                                                                          
                                                  "testModel.index(5, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'f\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6a8);
                                          QVariant::~QVariant(&local_5d0);
                                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                                            QPersistentModelIndex::data((int)&local_610);
                                            local_5ee = QVariant::value<QChar>(&local_610);
                                            QLatin1Char::QLatin1Char
                                                      ((QLatin1Char *)((long)&__range1_6 + 5),'c');
                                            QChar::QChar((QChar *)((long)&__range1_6 + 6),
                                                         __range1_6._5_1_);
                                            bVar1 = QTest::qCompare<QChar,QChar>
                                                              (&local_5ee,
                                                               (QChar *)((long)&__range1_6 + 6),
                                                               "twoIndex.data().value<QChar>()",
                                                               "QChar(QLatin1Char(\'c\'))",
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6a9);
                                            QVariant::~QVariant(&local_610);
                                            if (((bVar1 ^ 0xffU) & 1) == 0) {
                                              iVar3 = QPersistentModelIndex::row();
                                              bVar2 = QTest::qCompare(iVar3,3,"twoIndex.row()","3",
                                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6aa);
                                              if ((bVar2 & 1) == 0) {
                                                rowsMovedSpy._124_4_ = 1;
                                              }
                                              else {
                                                spy_6 = (QSignalSpy *)(spyArr + 1);
                                                __end1_6 = (QSignalSpy **)&resetData.parIndex;
                                                __begin1_6 = __end1_6;
                                                for (; (QSignalSpy *)__end1_6 != spy_6;
                                                    __end1_6 = __end1_6 + 1) {
                                                  local_638 = *__end1_6;
                                                  local_640 = QList<QList<QVariant>_>::count
                                                                        (&local_638->
                                                                                                                                                    
                                                  super_QList<QList<QVariant>_>);
                                                  args.d.size._4_4_ = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_640,
                                                                     (qint32 *)
                                                                     ((long)&args.d.size + 4),
                                                                     "spy->count()","1",
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6ac);
                                                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                    goto LAB_00138893;
                                                  }
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)local_660,
                                                             &local_638->
                                                              super_QList<QList<QVariant>_>);
                                                  pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                               local_660,0);
                                                  QVariant::value<QModelIndex>(&local_678,pQVar4);
                                                  bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    (&local_678,
                                                                     (QModelIndex *)local_90,
                                                                                                                                          
                                                  "args.at(0).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6ae);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_660,1);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(1).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6af);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_660,2);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(2).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6b0);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_660,3);
                                                    QVariant::value<QModelIndex>(&local_690,pQVar4);
                                                    bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                      (&local_690,
                                                                       (QModelIndex *)local_90,
                                                                                                                                              
                                                  "args.at(3).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6b1);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_660,4);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,4,
                                                  "args.at(4).toInt()","4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6b2);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 0;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  QList<QVariant>::~QList
                                                            ((QList<QVariant> *)local_660);
                                                  if (rowsMovedSpy._124_4_ != 0) goto LAB_00138893;
                                                }
                                                moveRowsTreeSameBranch::anon_class_16_2_c8a22591::
                                                operator()((anon_class_16_2_c8a22591 *)&__range1);
                                                GenericModel::index((int)local_6a8,(int)&probe + 8,
                                                                    (QModelIndex *)0x2);
                                                QPersistentModelIndex::operator=
                                                          (local_300,(QModelIndex *)local_6a8);
                                                bVar2 = GenericModel::moveRows
                                                                  ((QModelIndex *)&probe.field_0x8,
                                                                   (int)local_90,2,
                                                                   (QModelIndex *)0x1,(int)local_90)
                                                ;
                                                bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                                                                                                                              
                                                  "testModel.moveRows(parIndex, 2, 1, parIndex, 0)",
                                                  "",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6b7);
                                                if ((bVar2 & 1) == 0) {
                                                  rowsMovedSpy._124_4_ = 1;
                                                }
                                                else {
                                                  GenericModel::index((int)&local_6e0,
                                                                      (int)&probe + 8,
                                                                      (QModelIndex *)0x0);
                                                  QModelIndex::data(&local_6c8,&local_6e0,0);
                                                  iVar3 = QVariant::toInt((bool *)&local_6c8);
                                                  bVar2 = QTest::qCompare(iVar3,2,
                                                  "testModel.index(0, 0, parIndex).data().toInt()",
                                                  "2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6b8);
                                                  QVariant::~QVariant(&local_6c8);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::index((int)&local_718,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_700,&local_718,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_700);
                                                    bVar2 = QTest::qCompare(iVar3,0,
                                                  "testModel.index(1, 0, parIndex).data().toInt()",
                                                  "0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6b9);
                                                  QVariant::~QVariant(&local_700);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::index((int)&local_750,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x2);
                                                    QModelIndex::data(&local_738,&local_750,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_738);
                                                    bVar2 = QTest::qCompare(iVar3,1,
                                                  "testModel.index(2, 0, parIndex).data().toInt()",
                                                  "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6ba);
                                                  QVariant::~QVariant(&local_738);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::index((int)&local_788,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x3);
                                                    QModelIndex::data(&local_770,&local_788,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_770);
                                                    bVar2 = QTest::qCompare(iVar3,3,
                                                  "testModel.index(3, 0, parIndex).data().toInt()",
                                                  "3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6bb);
                                                  QVariant::~QVariant(&local_770);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::index((int)&local_7c0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x4);
                                                    QModelIndex::data(&local_7a8,&local_7c0,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_7a8);
                                                    bVar2 = QTest::qCompare(iVar3,4,
                                                  "testModel.index(4, 0, parIndex).data().toInt()",
                                                  "4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6bc);
                                                  QVariant::~QVariant(&local_7a8);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::index((int)&local_7f8,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x5);
                                                    QModelIndex::data(&local_7e0,&local_7f8,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_7e0);
                                                    bVar2 = QTest::qCompare(iVar3,5,
                                                  "testModel.index(5, 0, parIndex).data().toInt()",
                                                  "5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6bd);
                                                  QVariant::~QVariant(&local_7e0);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::index((int)&local_838,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_820,&local_838,0);
                                                    local_7fa = QVariant::value<QChar>(&local_820);
                                                    QLatin1Char::QLatin1Char(&local_83b,'c');
                                                    QChar::QChar(&local_83a,local_83b);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_7fa,&local_83a,
                                                                                                                                              
                                                  "testModel.index(0, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6be);
                                                  QVariant::~QVariant(&local_820);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_878,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_860,&local_878,0);
                                                    local_83e = QVariant::value<QChar>(&local_860);
                                                    QLatin1Char::QLatin1Char(&local_87b,'a');
                                                    QChar::QChar(&local_87a,local_87b);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_83e,&local_87a,
                                                                                                                                              
                                                  "testModel.index(1, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'a\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6bf);
                                                  QVariant::~QVariant(&local_860);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_8b8,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x2);
                                                    QModelIndex::data(&local_8a0,&local_8b8,0);
                                                    local_87e = QVariant::value<QChar>(&local_8a0);
                                                    QLatin1Char::QLatin1Char(&local_8bb,'b');
                                                    QChar::QChar(&local_8ba,local_8bb);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_87e,&local_8ba,
                                                                                                                                              
                                                  "testModel.index(2, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'b\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6c0);
                                                  QVariant::~QVariant(&local_8a0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_8f8,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x3);
                                                    QModelIndex::data(&local_8e0,&local_8f8,0);
                                                    local_8be = QVariant::value<QChar>(&local_8e0);
                                                    QLatin1Char::QLatin1Char(&local_8fb,'d');
                                                    QChar::QChar(&local_8fa,local_8fb);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_8be,&local_8fa,
                                                                                                                                              
                                                  "testModel.index(3, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'d\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6c1);
                                                  QVariant::~QVariant(&local_8e0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_938,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x4);
                                                    QModelIndex::data(&local_920,&local_938,0);
                                                    local_8fe = QVariant::value<QChar>(&local_920);
                                                    QLatin1Char::QLatin1Char(&local_93b,'e');
                                                    QChar::QChar(&local_93a,local_93b);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_8fe,&local_93a,
                                                                                                                                              
                                                  "testModel.index(4, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'e\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6c2);
                                                  QVariant::~QVariant(&local_920);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_978,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x5);
                                                    QModelIndex::data(&local_960,&local_978,0);
                                                    local_93e = QVariant::value<QChar>(&local_960);
                                                    QLatin1Char::QLatin1Char(&local_97b,'f');
                                                    QChar::QChar(&local_97a,local_97b);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_93e,&local_97a,
                                                                                                                                              
                                                  "testModel.index(5, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'f\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6c3);
                                                  QVariant::~QVariant(&local_960);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QPersistentModelIndex::data((int)&local_9a0);
                                                    local_97e = QVariant::value<QChar>(&local_9a0);
                                                    QLatin1Char::QLatin1Char
                                                              ((QLatin1Char *)
                                                               ((long)&__range1_7 + 5),'c');
                                                    QChar::QChar((QChar *)((long)&__range1_7 + 6),
                                                                 __range1_7._5_1_);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_97e,
                                                                       (QChar *)((long)&__range1_7 +
                                                                                6),
                                                                                                                                              
                                                  "twoIndex.data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6c4);
                                                  QVariant::~QVariant(&local_9a0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    iVar3 = QPersistentModelIndex::row();
                                                    bVar2 = QTest::qCompare(iVar3,0,"twoIndex.row()"
                                                                            ,"0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6c5);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    spy_7 = (QSignalSpy *)(spyArr + 1);
                                                    __end1_7 = (QSignalSpy **)&resetData.parIndex;
                                                    __begin1_7 = __end1_7;
                                                    for (; (QSignalSpy *)__end1_7 != spy_7;
                                                        __end1_7 = __end1_7 + 1) {
                                                      local_9c8 = *__end1_7;
                                                      local_9d0 = QList<QList<QVariant>_>::count
                                                                            (&local_9c8->
                                                                                                                                                            
                                                  super_QList<QList<QVariant>_>);
                                                  args_1.d.size._4_4_ = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_9d0,
                                                                     (qint32 *)
                                                                     ((long)&args_1.d.size + 4),
                                                                     "spy->count()","1",
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6c7);
                                                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                    goto LAB_00138893;
                                                  }
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)local_9f0,
                                                             &local_9c8->
                                                              super_QList<QList<QVariant>_>);
                                                  pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                               local_9f0,0);
                                                  QVariant::value<QModelIndex>(&local_a08,pQVar4);
                                                  bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    (&local_a08,
                                                                     (QModelIndex *)local_90,
                                                                                                                                          
                                                  "args.at(0).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6c9);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_9f0,1);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(1).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6ca);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_9f0,2);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(2).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6cb);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_9f0,3);
                                                    QVariant::value<QModelIndex>(&local_a20,pQVar4);
                                                    bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                      (&local_a20,
                                                                       (QModelIndex *)local_90,
                                                                                                                                              
                                                  "args.at(3).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6cc);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_9f0,4);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,0,
                                                  "args.at(4).toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6cd);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 0;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  QList<QVariant>::~QList
                                                            ((QList<QVariant> *)local_9f0);
                                                  if (rowsMovedSpy._124_4_ != 0) goto LAB_00138893;
                                                  }
                                                  moveRowsTreeSameBranch::anon_class_16_2_c8a22591::
                                                  operator()((anon_class_16_2_c8a22591 *)&__range1);
                                                  GenericModel::index((int)local_a38,(int)&probe + 8
                                                                      ,(QModelIndex *)0x2);
                                                  QPersistentModelIndex::operator=
                                                            (local_300,(QModelIndex *)local_a38);
                                                  bVar2 = GenericModel::moveRows
                                                                    ((QModelIndex *)&probe.field_0x8
                                                                     ,(int)local_90,2,
                                                                     (QModelIndex *)0x1,
                                                                     (int)local_90);
                                                  bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                                                                                                                                  
                                                  "testModel.moveRows(parIndex, 2, 1, parIndex, 6)",
                                                  "",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6d2);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    GenericModel::index((int)&local_a70,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_a58,&local_a70,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_a58);
                                                    bVar2 = QTest::qCompare(iVar3,0,
                                                  "testModel.index(0, 0, parIndex).data().toInt()",
                                                  "0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6d3);
                                                  QVariant::~QVariant(&local_a58);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::index((int)&local_aa8,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_a90,&local_aa8,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_a90);
                                                    bVar2 = QTest::qCompare(iVar3,1,
                                                  "testModel.index(1, 0, parIndex).data().toInt()",
                                                  "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6d4);
                                                  QVariant::~QVariant(&local_a90);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::index((int)&local_ae0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x2);
                                                    QModelIndex::data(&local_ac8,&local_ae0,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_ac8);
                                                    bVar2 = QTest::qCompare(iVar3,3,
                                                  "testModel.index(2, 0, parIndex).data().toInt()",
                                                  "3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6d5);
                                                  QVariant::~QVariant(&local_ac8);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::index((int)&local_b18,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x3);
                                                    QModelIndex::data(&local_b00,&local_b18,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_b00);
                                                    bVar2 = QTest::qCompare(iVar3,4,
                                                  "testModel.index(3, 0, parIndex).data().toInt()",
                                                  "4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6d6);
                                                  QVariant::~QVariant(&local_b00);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::index((int)&local_b50,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x4);
                                                    QModelIndex::data(&local_b38,&local_b50,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_b38);
                                                    bVar2 = QTest::qCompare(iVar3,5,
                                                  "testModel.index(4, 0, parIndex).data().toInt()",
                                                  "5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6d7);
                                                  QVariant::~QVariant(&local_b38);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::index((int)&local_b88,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x5);
                                                    QModelIndex::data(&local_b70,&local_b88,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_b70);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "testModel.index(5, 0, parIndex).data().toInt()",
                                                  "2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6d8);
                                                  QVariant::~QVariant(&local_b70);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::index((int)&local_bc8,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_bb0,&local_bc8,0);
                                                    local_b8a = QVariant::value<QChar>(&local_bb0);
                                                    QLatin1Char::QLatin1Char(&local_bcb,'a');
                                                    QChar::QChar(&local_bca,local_bcb);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_b8a,&local_bca,
                                                                                                                                              
                                                  "testModel.index(0, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'a\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6d9);
                                                  QVariant::~QVariant(&local_bb0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_c08,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_bf0,&local_c08,0);
                                                    local_bce = QVariant::value<QChar>(&local_bf0);
                                                    QLatin1Char::QLatin1Char(&local_c0b,'b');
                                                    QChar::QChar(&local_c0a,local_c0b);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_bce,&local_c0a,
                                                                                                                                              
                                                  "testModel.index(1, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'b\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6da);
                                                  QVariant::~QVariant(&local_bf0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_c48,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x2);
                                                    QModelIndex::data(&local_c30,&local_c48,0);
                                                    local_c0e = QVariant::value<QChar>(&local_c30);
                                                    QLatin1Char::QLatin1Char(&local_c4b,'d');
                                                    QChar::QChar(&local_c4a,local_c4b);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_c0e,&local_c4a,
                                                                                                                                              
                                                  "testModel.index(2, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'d\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6db);
                                                  QVariant::~QVariant(&local_c30);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_c88,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x3);
                                                    QModelIndex::data(&local_c70,&local_c88,0);
                                                    local_c4e = QVariant::value<QChar>(&local_c70);
                                                    QLatin1Char::QLatin1Char(&local_c8b,'e');
                                                    QChar::QChar(&local_c8a,local_c8b);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_c4e,&local_c8a,
                                                                                                                                              
                                                  "testModel.index(3, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'e\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6dc);
                                                  QVariant::~QVariant(&local_c70);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_cc8,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x4);
                                                    QModelIndex::data(&local_cb0,&local_cc8,0);
                                                    local_c8e = QVariant::value<QChar>(&local_cb0);
                                                    QLatin1Char::QLatin1Char(&local_ccb,'f');
                                                    QChar::QChar(&local_cca,local_ccb);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_c8e,&local_cca,
                                                                                                                                              
                                                  "testModel.index(4, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'f\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6dd);
                                                  QVariant::~QVariant(&local_cb0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_d08,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x5);
                                                    QModelIndex::data(&local_cf0,&local_d08,0);
                                                    local_cce = QVariant::value<QChar>(&local_cf0);
                                                    QLatin1Char::QLatin1Char(&local_d0b,'c');
                                                    QChar::QChar(&local_d0a,local_d0b);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_cce,&local_d0a,
                                                                                                                                              
                                                  "testModel.index(5, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6de);
                                                  QVariant::~QVariant(&local_cf0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QPersistentModelIndex::data((int)&local_d30);
                                                    local_d0e = QVariant::value<QChar>(&local_d30);
                                                    QLatin1Char::QLatin1Char
                                                              ((QLatin1Char *)
                                                               ((long)&__range1_8 + 5),'c');
                                                    QChar::QChar((QChar *)((long)&__range1_8 + 6),
                                                                 __range1_8._5_1_);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_d0e,
                                                                       (QChar *)((long)&__range1_8 +
                                                                                6),
                                                                                                                                              
                                                  "twoIndex.data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6df);
                                                  QVariant::~QVariant(&local_d30);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    iVar3 = QPersistentModelIndex::row();
                                                    bVar2 = QTest::qCompare(iVar3,5,"twoIndex.row()"
                                                                            ,"5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6e0);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    spy_8 = (QSignalSpy *)(spyArr + 1);
                                                    __end1_8 = (QSignalSpy **)&resetData.parIndex;
                                                    __begin1_8 = __end1_8;
                                                    for (; (QSignalSpy *)__end1_8 != spy_8;
                                                        __end1_8 = __end1_8 + 1) {
                                                      local_d58 = *__end1_8;
                                                      local_d60 = QList<QList<QVariant>_>::count
                                                                            (&local_d58->
                                                                                                                                                            
                                                  super_QList<QList<QVariant>_>);
                                                  args_2.d.size._4_4_ = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_d60,
                                                                     (qint32 *)
                                                                     ((long)&args_2.d.size + 4),
                                                                     "spy->count()","1",
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6e2);
                                                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                    goto LAB_00138893;
                                                  }
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)local_d80,
                                                             &local_d58->
                                                              super_QList<QList<QVariant>_>);
                                                  pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                               local_d80,0);
                                                  QVariant::value<QModelIndex>(&local_d98,pQVar4);
                                                  bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    (&local_d98,
                                                                     (QModelIndex *)local_90,
                                                                                                                                          
                                                  "args.at(0).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6e4);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_d80,1);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(1).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6e5);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_d80,2);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(2).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6e6);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_d80,3);
                                                    QVariant::value<QModelIndex>
                                                              ((QModelIndex *)&oneIndex,pQVar4);
                                                    bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                      ((QModelIndex *)&oneIndex,
                                                                       (QModelIndex *)local_90,
                                                                                                                                              
                                                  "args.at(3).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6e7);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_d80,4);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,6,
                                                  "args.at(4).toInt()","6",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6e8);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 0;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  QList<QVariant>::~QList
                                                            ((QList<QVariant> *)local_d80);
                                                  if (rowsMovedSpy._124_4_ != 0) goto LAB_00138893;
                                                  }
                                                  moveRowsTreeSameBranch::anon_class_16_2_c8a22591::
                                                  operator()((anon_class_16_2_c8a22591 *)&__range1);
                                                  GenericModel::index((int)local_dd0,(int)&probe + 8
                                                                      ,(QModelIndex *)0x1);
                                                  QPersistentModelIndex::QPersistentModelIndex
                                                            (local_db8,(QModelIndex *)local_dd0);
                                                  bVar2 = GenericModel::moveRows
                                                                    ((QModelIndex *)&probe.field_0x8
                                                                     ,(int)local_90,0,
                                                                     (QModelIndex *)0x2,
                                                                     (int)local_90);
                                                  bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                                                                                                                                  
                                                  "testModel.moveRows(parIndex, 0, 2, parIndex, 3)",
                                                  "",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6ed);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    GenericModel::index((int)&local_e08,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_df0,&local_e08,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_df0);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "testModel.index(0, 0, parIndex).data().toInt()",
                                                  "2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6ee);
                                                  QVariant::~QVariant(&local_df0);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::index((int)&local_e40,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_e28,&local_e40,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_e28);
                                                    bVar2 = QTest::qCompare(iVar3,0,
                                                  "testModel.index(1, 0, parIndex).data().toInt()",
                                                  "0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6ef);
                                                  QVariant::~QVariant(&local_e28);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::index((int)&local_e78,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x2);
                                                    QModelIndex::data(&local_e60,&local_e78,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_e60);
                                                    bVar2 = QTest::qCompare(iVar3,1,
                                                  "testModel.index(2, 0, parIndex).data().toInt()",
                                                  "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6f0);
                                                  QVariant::~QVariant(&local_e60);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::index((int)&local_eb0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x3);
                                                    QModelIndex::data(&local_e98,&local_eb0,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_e98);
                                                    bVar2 = QTest::qCompare(iVar3,3,
                                                  "testModel.index(3, 0, parIndex).data().toInt()",
                                                  "3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6f1);
                                                  QVariant::~QVariant(&local_e98);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::index((int)&local_ee8,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x4);
                                                    QModelIndex::data(&local_ed0,&local_ee8,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_ed0);
                                                    bVar2 = QTest::qCompare(iVar3,4,
                                                  "testModel.index(4, 0, parIndex).data().toInt()",
                                                  "4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6f2);
                                                  QVariant::~QVariant(&local_ed0);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::index((int)&local_f20,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x5);
                                                    QModelIndex::data(&local_f08,&local_f20,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_f08);
                                                    bVar2 = QTest::qCompare(iVar3,5,
                                                  "testModel.index(5, 0, parIndex).data().toInt()",
                                                  "5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6f3);
                                                  QVariant::~QVariant(&local_f08);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::index((int)&local_f60,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_f48,&local_f60,0);
                                                    local_f22 = QVariant::value<QChar>(&local_f48);
                                                    QLatin1Char::QLatin1Char(&local_f63,'c');
                                                    QChar::QChar(&local_f62,local_f63);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_f22,&local_f62,
                                                                                                                                              
                                                  "testModel.index(0, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6f4);
                                                  QVariant::~QVariant(&local_f48);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_fa0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_f88,&local_fa0,0);
                                                    local_f66 = QVariant::value<QChar>(&local_f88);
                                                    QLatin1Char::QLatin1Char(&local_fa3,'a');
                                                    QChar::QChar(&local_fa2,local_fa3);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_f66,&local_fa2,
                                                                                                                                              
                                                  "testModel.index(1, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'a\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6f5);
                                                  QVariant::~QVariant(&local_f88);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_fe0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x2);
                                                    QModelIndex::data(&local_fc8,&local_fe0,0);
                                                    local_fa6 = QVariant::value<QChar>(&local_fc8);
                                                    QLatin1Char::QLatin1Char(&local_fe3,'b');
                                                    QChar::QChar(&local_fe2,local_fe3);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_fa6,&local_fe2,
                                                                                                                                              
                                                  "testModel.index(2, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'b\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6f6);
                                                  QVariant::~QVariant(&local_fc8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1020,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x3);
                                                    QModelIndex::data(&local_1008,&local_1020,0);
                                                    local_fe6 = QVariant::value<QChar>(&local_1008);
                                                    QLatin1Char::QLatin1Char(&local_1023,'d');
                                                    QChar::QChar(&local_1022,local_1023);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_fe6,&local_1022,
                                                                                                                                              
                                                  "testModel.index(3, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'d\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6f7);
                                                  QVariant::~QVariant(&local_1008);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1060,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x4);
                                                    QModelIndex::data(&local_1048,&local_1060,0);
                                                    local_1026 = QVariant::value<QChar>(&local_1048)
                                                    ;
                                                    QLatin1Char::QLatin1Char(&local_1063,'e');
                                                    QChar::QChar(&local_1062,local_1063);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_1026,&local_1062,
                                                                                                                                              
                                                  "testModel.index(4, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'e\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6f8);
                                                  QVariant::~QVariant(&local_1048);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_10a0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x5);
                                                    QModelIndex::data(&local_1088,&local_10a0,0);
                                                    local_1066 = QVariant::value<QChar>(&local_1088)
                                                    ;
                                                    QLatin1Char::QLatin1Char(&local_10a3,'f');
                                                    QChar::QChar(&local_10a2,local_10a3);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_1066,&local_10a2,
                                                                                                                                              
                                                  "testModel.index(5, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'f\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6f9);
                                                  QVariant::~QVariant(&local_1088);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QPersistentModelIndex::data((int)&local_10c8);
                                                    local_10a6 = QVariant::value<QChar>(&local_10c8)
                                                    ;
                                                    QLatin1Char::QLatin1Char
                                                              ((QLatin1Char *)
                                                               ((long)&__range1_9 + 5),'b');
                                                    QChar::QChar((QChar *)((long)&__range1_9 + 6),
                                                                 __range1_9._5_1_);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_10a6,
                                                                       (QChar *)((long)&__range1_9 +
                                                                                6),
                                                                                                                                              
                                                  "oneIndex.data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'b\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6fa);
                                                  QVariant::~QVariant(&local_10c8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    iVar3 = QPersistentModelIndex::row();
                                                    bVar2 = QTest::qCompare(iVar3,2,"oneIndex.row()"
                                                                            ,"2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6fb);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    spy_9 = (QSignalSpy *)(spyArr + 1);
                                                    __end1_9 = (QSignalSpy **)&resetData.parIndex;
                                                    __begin1_9 = __end1_9;
                                                    for (; (QSignalSpy *)__end1_9 != spy_9;
                                                        __end1_9 = __end1_9 + 1) {
                                                      local_10f0 = *__end1_9;
                                                      local_10f8 = QList<QList<QVariant>_>::count
                                                                             (&local_10f0->
                                                                                                                                                              
                                                  super_QList<QList<QVariant>_>);
                                                  args_3.d.size._4_4_ = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_10f8,
                                                                     (qint32 *)
                                                                     ((long)&args_3.d.size + 4),
                                                                     "spy->count()","1",
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6fd);
                                                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                    goto LAB_00138887;
                                                  }
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)local_1118,
                                                             &local_10f0->
                                                              super_QList<QList<QVariant>_>);
                                                  pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                               local_1118,0);
                                                  QVariant::value<QModelIndex>(&local_1130,pQVar4);
                                                  bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    (&local_1130,
                                                                     (QModelIndex *)local_90,
                                                                                                                                          
                                                  "args.at(0).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6ff);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_1118,1);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,0,
                                                  "args.at(1).toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x700);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_1118,2);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,1,
                                                  "args.at(2).toInt()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x701);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_1118,3);
                                                    QVariant::value<QModelIndex>(&local_1148,pQVar4)
                                                    ;
                                                    bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                      (&local_1148,
                                                                       (QModelIndex *)local_90,
                                                                                                                                              
                                                  "args.at(3).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x702);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_1118,4);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,3,
                                                  "args.at(4).toInt()","3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x703);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 0;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  QList<QVariant>::~QList
                                                            ((QList<QVariant> *)local_1118);
                                                  if (rowsMovedSpy._124_4_ != 0) goto LAB_00138887;
                                                  }
                                                  rowsMovedSpy._124_4_ = 0;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
LAB_00138887:
                                                  QPersistentModelIndex::~QPersistentModelIndex
                                                            (local_db8);
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                }
                                              }
                                            }
                                            else {
                                              rowsMovedSpy._124_4_ = 1;
                                            }
                                          }
                                          else {
                                            rowsMovedSpy._124_4_ = 1;
                                          }
                                        }
                                        else {
                                          rowsMovedSpy._124_4_ = 1;
                                        }
                                      }
                                      else {
                                        rowsMovedSpy._124_4_ = 1;
                                      }
                                    }
                                    else {
                                      rowsMovedSpy._124_4_ = 1;
                                    }
                                  }
                                  else {
                                    rowsMovedSpy._124_4_ = 1;
                                  }
                                }
                                else {
                                  rowsMovedSpy._124_4_ = 1;
                                }
                              }
                              else {
                                rowsMovedSpy._124_4_ = 1;
                              }
                            }
                            else {
                              rowsMovedSpy._124_4_ = 1;
                            }
                          }
                          else {
                            rowsMovedSpy._124_4_ = 1;
                          }
                        }
                        else {
                          rowsMovedSpy._124_4_ = 1;
                        }
                      }
                      else {
                        rowsMovedSpy._124_4_ = 1;
                      }
                    }
                    else {
                      rowsMovedSpy._124_4_ = 1;
                    }
                  }
LAB_00138893:
                  QPersistentModelIndex::~QPersistentModelIndex(local_300);
                }
              }
            }
          }
        }
      }
    }
LAB_0013889f:
    QSignalSpy::~QSignalSpy((QSignalSpy *)local_1b0);
  }
  QSignalSpy::~QSignalSpy((QSignalSpy *)local_128);
  ModelTest::~ModelTest((ModelTest *)local_38);
  GenericModel::~GenericModel((GenericModel *)&probe.field_0x8);
  return;
}

Assistant:

void tst_GenericModel::moveRowsTreeSameBranch()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    testModel.insertColumns(0, 2);
    testModel.insertRows(0, 3);
    const QModelIndex parIndex = testModel.index(1, 0);
    testModel.insertColumns(0, 2, parIndex);
    testModel.insertRows(0, 6, parIndex);
    QSignalSpy rowsAboutToBeMovedSpy(&testModel, SIGNAL(rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsAboutToBeMovedSpy.isValid());
    QSignalSpy rowsMovedSpy(&testModel, SIGNAL(rowsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsMovedSpy.isValid());
    QSignalSpy *spyArr[] = {&rowsAboutToBeMovedSpy, &rowsMovedSpy};
    const auto resetData = [&testModel, &parIndex]() {
        for (int i = 0; i < 6; ++i) {
            testModel.setData(testModel.index(i, 0, parIndex), i);
            testModel.setData(testModel.index(i, 1, parIndex), QChar('a' + i));
        }
    };

    resetData();
    QVERIFY(!testModel.moveRows(parIndex, 2, 1, parIndex, -1));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, 2, 1, parIndex, 7));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, -1, 1, parIndex, 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, 6, 1, parIndex, 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, 1, 2, parIndex, 2));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, 1, 2, parIndex, 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);

    QPersistentModelIndex twoIndex = testModel.index(2, 1, parIndex);
    QVERIFY(testModel.moveRows(parIndex, 2, 1, parIndex, 4));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toInt(), 0);
    QCOMPARE(testModel.index(1, 0, parIndex).data().toInt(), 1);
    QCOMPARE(testModel.index(2, 0, parIndex).data().toInt(), 3);
    QCOMPARE(testModel.index(3, 0, parIndex).data().toInt(), 2);
    QCOMPARE(testModel.index(4, 0, parIndex).data().toInt(), 4);
    QCOMPARE(testModel.index(5, 0, parIndex).data().toInt(), 5);
    QCOMPARE(testModel.index(0, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(1, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(2, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(3, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(testModel.index(4, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(5, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(twoIndex.data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.row(), 3);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 4);
    }

    resetData();
    twoIndex = testModel.index(2, 1, parIndex);
    QVERIFY(testModel.moveRows(parIndex, 2, 1, parIndex, 0));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toInt(), 2);
    QCOMPARE(testModel.index(1, 0, parIndex).data().toInt(), 0);
    QCOMPARE(testModel.index(2, 0, parIndex).data().toInt(), 1);
    QCOMPARE(testModel.index(3, 0, parIndex).data().toInt(), 3);
    QCOMPARE(testModel.index(4, 0, parIndex).data().toInt(), 4);
    QCOMPARE(testModel.index(5, 0, parIndex).data().toInt(), 5);
    QCOMPARE(testModel.index(0, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(testModel.index(1, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(2, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(3, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(4, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(5, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(twoIndex.data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.row(), 0);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 0);
    }

    resetData();
    twoIndex = testModel.index(2, 1, parIndex);
    QVERIFY(testModel.moveRows(parIndex, 2, 1, parIndex, 6));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toInt(), 0);
    QCOMPARE(testModel.index(1, 0, parIndex).data().toInt(), 1);
    QCOMPARE(testModel.index(2, 0, parIndex).data().toInt(), 3);
    QCOMPARE(testModel.index(3, 0, parIndex).data().toInt(), 4);
    QCOMPARE(testModel.index(4, 0, parIndex).data().toInt(), 5);
    QCOMPARE(testModel.index(5, 0, parIndex).data().toInt(), 2);
    QCOMPARE(testModel.index(0, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(1, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(2, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(3, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(4, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(testModel.index(5, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.row(), 5);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 6);
    }

    resetData();
    QPersistentModelIndex oneIndex = testModel.index(1, 1, parIndex);
    QVERIFY(testModel.moveRows(parIndex, 0, 2, parIndex, 3));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toInt(), 2);
    QCOMPARE(testModel.index(1, 0, parIndex).data().toInt(), 0);
    QCOMPARE(testModel.index(2, 0, parIndex).data().toInt(), 1);
    QCOMPARE(testModel.index(3, 0, parIndex).data().toInt(), 3);
    QCOMPARE(testModel.index(4, 0, parIndex).data().toInt(), 4);
    QCOMPARE(testModel.index(5, 0, parIndex).data().toInt(), 5);
    QCOMPARE(testModel.index(0, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(testModel.index(1, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(2, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(3, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(4, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(5, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(oneIndex.data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(oneIndex.row(), 2);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(2).toInt(), 1);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 3);
    }
}